

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readSOS(FILE *f)

{
  byte local_19;
  int local_18;
  uint uStack_14;
  uchar v [1];
  int i;
  uint len;
  FILE *f_local;
  
  uStack_14 = EnterNewSection(f,"SOS");
  fseek((FILE *)f,1,1);
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    fread(&local_19,1,1,(FILE *)f);
    printf(anon_var_dwarf_3198,(ulong)local_19);
    fread(&local_19,1,1,(FILE *)f);
    printf(anon_var_dwarf_31a3,(ulong)(uint)((int)(uint)local_19 >> 4));
    printf(anon_var_dwarf_31ba,(ulong)(local_19 & 0xf));
  }
  fseek((FILE *)f,3,1);
  return;
}

Assistant:

void readSOS(FILE *f) {
    unsigned int len = EnterNewSection(f, "SOS");

    fseek(f, 1, SEEK_CUR);   // 顏色分量數，固定為3
    for (int i = 0; i < 3; i++) {
        unsigned char v[1];
        fread(v, 1, 1, f);
        printf("顏色分量id：%d\n", v[0]);
        fread(v, 1, 1, f);
        printf("DC霍夫曼id：%d\n", v[0] >> 4);
        printf("AC霍夫曼id：%d\n", v[0] & 0x0F);
    }
    fseek(f, 3, SEEK_CUR);
}